

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.cxx
# Opt level: O2

bool __thiscall
cmCMakeMinimumRequired::InitialPass
          (cmCMakeMinimumRequired *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  uint required_minor;
  uint required_major;
  uint required_tweak;
  uint required_patch;
  string local_1f0;
  string version_string;
  ostringstream e;
  
  version_string._M_dataplus._M_p = (pointer)&version_string.field_2;
  version_string._M_string_length = 0;
  version_string.field_2._M_local_buf[0] = '\0';
  uVar8 = 0;
  bVar5 = false;
  while( true ) {
    uVar9 = (ulong)uVar8;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
    break;
    bVar3 = std::operator==(pbVar1 + uVar9,"VERSION");
    bVar4 = true;
    if (!bVar3) {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"FATAL_ERROR");
      if (bVar4) {
        if (bVar5) {
          std::__cxx11::string::string
                    ((string *)&e,"called with no value for VERSION.",(allocator *)&local_1f0);
          cmCommand::SetError(&this->super_cmCommand,(string *)&e);
          goto LAB_00399701;
        }
      }
      else {
        if (!bVar5) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->UnknownArguments,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar9);
          bVar4 = bVar5;
          goto LAB_0039959a;
        }
        std::__cxx11::string::_M_assign((string *)&version_string);
      }
      bVar4 = false;
    }
LAB_0039959a:
    bVar5 = bVar4;
    uVar8 = uVar8 + 1;
  }
  if (bVar5) {
    std::__cxx11::string::string
              ((string *)&e,"called with no value for VERSION.",(allocator *)&local_1f0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_00399701:
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    if (version_string._M_string_length == 0) {
      bVar5 = EnforceUnknownArguments(this);
      goto LAB_0039970d;
    }
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&e,"CMAKE_MINIMUM_REQUIRED_VERSION",(allocator *)&local_1f0);
    cmMakefile::AddDefinition(pcVar2,(string *)&e,version_string._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&e);
    cmVersion::GetMajorVersion();
    cmVersion::GetMinorVersion();
    cmVersion::GetPatchVersion();
    cmVersion::GetTweakVersion();
    iVar6 = __isoc99_sscanf(version_string._M_dataplus._M_p,"%u.%u.%u.%u");
    if (iVar6 < 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,"could not parse VERSION \"");
      poVar7 = std::operator<<(poVar7,(string *)&version_string);
      std::operator<<(poVar7,"\".");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    else {
      bVar5 = EnforceUnknownArguments(this);
      if (bVar5) {
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string
                  ((string *)&e,"Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.",
                   (allocator *)&local_1f0);
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar5 = true;
        cmMakefile::SetPolicyVersion((this->super_cmCommand).Makefile,"2.4");
        goto LAB_0039970d;
      }
    }
  }
  bVar5 = false;
LAB_0039970d:
  std::__cxx11::string::~string((string *)&version_string);
  return bVar5;
}

Assistant:

bool cmCMakeMinimumRequired
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // Process arguments.
  std::string version_string;
  bool doing_version = false;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    if(args[i] == "VERSION")
      {
      doing_version = true;
      }
    else if(args[i] == "FATAL_ERROR")
      {
      if(doing_version)
        {
        this->SetError("called with no value for VERSION.");
        return false;
        }
      doing_version = false;
      }
    else if(doing_version)
      {
      doing_version = false;
      version_string = args[i];
      }
    else
      {
      this->UnknownArguments.push_back(args[i]);
      }
    }
  if(doing_version)
    {
    this->SetError("called with no value for VERSION.");
    return false;
    }

  // Make sure there was a version to check.
  if(version_string.empty())
    {
    return this->EnforceUnknownArguments();
    }

  // Save the required version string.
  this->Makefile->AddDefinition("CMAKE_MINIMUM_REQUIRED_VERSION",
                                version_string.c_str());


  // Get the current version number.
  unsigned int current_major = cmVersion::GetMajorVersion();
  unsigned int current_minor = cmVersion::GetMinorVersion();
  unsigned int current_patch = cmVersion::GetPatchVersion();
  unsigned int current_tweak = cmVersion::GetTweakVersion();

  // Parse at least two components of the version number.
  // Use zero for those not specified.
  unsigned int required_major = 0;
  unsigned int required_minor = 0;
  unsigned int required_patch = 0;
  unsigned int required_tweak = 0;
  if(sscanf(version_string.c_str(), "%u.%u.%u.%u",
            &required_major, &required_minor,
            &required_patch, &required_tweak) < 2)
    {
    std::ostringstream e;
    e << "could not parse VERSION \"" << version_string << "\".";
    this->SetError(e.str());
    return false;
    }

  // Compare the version numbers.
  if((current_major < required_major) ||
     (current_major == required_major &&
      current_minor < required_minor) ||
     (current_major == required_major &&
      current_minor == required_minor &&
      current_patch < required_patch) ||
     (current_major == required_major &&
      current_minor == required_minor &&
      current_patch == required_patch &&
      current_tweak < required_tweak))
    {
    // The current version is too low.
    std::ostringstream e;
    e << "CMake " << version_string
      << " or higher is required.  You are running version "
      << cmVersion::GetCMakeVersion();
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }

  // The version is not from the future, so enforce unknown arguments.
  if(!this->EnforceUnknownArguments())
    {
    return false;
    }

  if (required_major < 2 || (required_major == 2 && required_minor < 4))
  {
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.");
    this->Makefile->SetPolicyVersion("2.4");
  }
  else
  {
    this->Makefile->SetPolicyVersion(version_string.c_str());
  }

  return true;
}